

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_start_union_vector(flatcc_builder_t *B)

{
  int iVar1;
  flatcc_builder_t *B_local;
  
  iVar1 = enter_frame(B,4);
  if (iVar1 == 0) {
    (B->frame->container).table.vs_end = 8;
    (B->frame->container).table.pl_end = 0;
    B->frame->type = 7;
    refresh_ds(B,0xfffffffc);
    B_local._4_4_ = 0;
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_start_union_vector(flatcc_builder_t *B)
{
    if (enter_frame(B, field_size)) {
        return -1;
    }
    frame(container.vector.elem_size) = union_size;
    frame(container.vector.count) = 0;
    frame(type) = flatcc_builder_union_vector;
    refresh_ds(B, data_limit);
    return 0;
}